

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_wordembedding(Model *this,WordEmbedding *wordembedding)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  WordEmbedding *wordembedding_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (wordembedding != (WordEmbedding *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&wordembedding->super_MessageLite);
    message_arena = (Arena *)wordembedding;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::CoreMLModels::WordEmbedding>
                              (message_arena_00,wordembedding,submessage_arena_00);
    }
    set_has_wordembedding(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_wordembedding(::CoreML::Specification::CoreMLModels::WordEmbedding* wordembedding) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (wordembedding) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(wordembedding));
    if (message_arena != submessage_arena) {
      wordembedding = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, wordembedding, submessage_arena);
    }
    set_has_wordembedding();
    Type_.wordembedding_ = wordembedding;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.wordEmbedding)
}